

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instanced_geometry_device.cpp
# Opt level: O0

void embree::renderTileStandard
               (int taskIndex,int threadIndex,int *pixels,uint width,uint height,float time,
               ISPCCamera *camera,int numTilesX,int numTilesY)

{
  float fVar1;
  float in_ECX;
  float fVar2;
  uint x_00;
  undefined8 in_RDX;
  undefined4 in_ESI;
  int in_EDI;
  uint in_R8D;
  int in_stack_00000008;
  uint x;
  uint y;
  uint y1;
  uint y0;
  uint x1;
  uint x0;
  uint tileX;
  uint tileY;
  undefined4 in_stack_00000084;
  undefined4 in_stack_0000008c;
  uint local_60;
  float local_5c;
  float local_58;
  uint local_54;
  float fVar3;
  
  fVar1 = (float)((in_EDI - (in_EDI / in_stack_00000008) * in_stack_00000008) * 8);
  fVar2 = (float)((int)fVar1 + 8);
  local_5c = in_ECX;
  if ((uint)fVar2 < (uint)in_ECX) {
    local_5c = fVar2;
  }
  local_54 = (in_EDI / in_stack_00000008) * 8;
  x_00 = local_54 + 8;
  fVar3 = in_ECX;
  local_60 = in_R8D;
  if (x_00 < in_R8D) {
    local_60 = x_00;
  }
  for (; local_58 = fVar1, local_54 < local_60; local_54 = local_54 + 1) {
    for (; (uint)local_58 < (uint)local_5c; local_58 = (float)((int)local_58 + 1)) {
      renderPixelStandard((TutorialData *)CONCAT44(fVar2,fVar3),x_00,in_R8D,
                          (int *)CONCAT44(in_EDI,in_ESI),(uint)((ulong)in_RDX >> 0x20),(uint)in_RDX,
                          in_ECX,(ISPCCamera *)CONCAT44(in_stack_00000084,numTilesX),
                          (RayStats *)CONCAT44(in_stack_0000008c,numTilesY));
    }
  }
  return;
}

Assistant:

void renderTileStandard(int taskIndex,
                        int threadIndex,
                        int* pixels,
                        const unsigned int width,
                        const unsigned int height,
                        const float time,
                        const ISPCCamera& camera,
                        const int numTilesX,
                        const int numTilesY)
{
  const unsigned int tileY = taskIndex / numTilesX;
  const unsigned int tileX = taskIndex - tileY * numTilesX;
  const unsigned int x0 = tileX * TILE_SIZE_X;
  const unsigned int x1 = min(x0+TILE_SIZE_X,width);
  const unsigned int y0 = tileY * TILE_SIZE_Y;
  const unsigned int y1 = min(y0+TILE_SIZE_Y,height);

  for (unsigned int y=y0; y<y1; y++) for (unsigned int x=x0; x<x1; x++)
  {
    renderPixelStandard(data,x,y,pixels,width,height,time,camera,g_stats[threadIndex]);
  }
}